

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O3

void __thiscall CholeskyFactor::resize(CholeskyFactor *this,HighsInt new_k_max)

{
  uint uVar1;
  pointer pdVar2;
  uint uVar3;
  ulong uVar4;
  pointer pdVar5;
  HighsInt j;
  ulong uVar6;
  vector<double,_std::allocator<double>_> L_old;
  vector<double,_std::allocator<double>_> local_30;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_30,&this->L);
  pdVar2 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar2) {
    (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar2;
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&this->L,(ulong)(uint)(new_k_max * new_k_max));
  uVar1 = this->current_k_max;
  uVar3 = new_k_max;
  if ((int)uVar1 < new_k_max) {
    uVar3 = uVar1;
  }
  if ((int)uVar3 < 1) {
    this->current_k_max = new_k_max;
    if (local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    pdVar2 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    pdVar5 = local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar6 = 0;
      do {
        pdVar2[uVar6] = pdVar5[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
      uVar4 = uVar4 + 1;
      pdVar2 = pdVar2 + new_k_max;
      pdVar5 = pdVar5 + (int)uVar1;
    } while (uVar4 != uVar3);
    this->current_k_max = new_k_max;
  }
  operator_delete(local_30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void resize(HighsInt new_k_max) {
    std::vector<double> L_old = L;
    L.clear();
    L.resize((new_k_max) * (new_k_max));
    const HighsInt l_size = L.size();
    // Driven by #958, changes made in following lines to avoid array
    // bound error when new_k_max < current_k_max
    HighsInt min_k_max = min(new_k_max, current_k_max);
    for (HighsInt i = 0; i < min_k_max; i++) {
      for (HighsInt j = 0; j < min_k_max; j++) {
        assert(i * (new_k_max) + j < l_size);
        L[i * (new_k_max) + j] = L_old[i * current_k_max + j];
      }
    }
    current_k_max = new_k_max;
  }